

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::OneofDescriptorProto::~OneofDescriptorProto(OneofDescriptorProto *this)

{
  ~OneofDescriptorProto(this);
  operator_delete(this);
  return;
}

Assistant:

OneofDescriptorProto::~OneofDescriptorProto() {
  // @@protoc_insertion_point(destructor:google.protobuf.OneofDescriptorProto)
  SharedDtor();
}